

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GenerateOutput
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,OutputDirective *output_directive,GeneratorContext *generator_context)

{
  pointer pcVar1;
  string *psVar2;
  bool bVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  int iVar6;
  mapped_type *pmVar7;
  ostream *poVar8;
  LogMessage *pLVar9;
  _Alloc_hider _Var10;
  string plugin_name;
  string parameters_1;
  string error;
  string parameters;
  string local_e8;
  string local_c8;
  string local_a8;
  undefined1 local_88 [56];
  long *local_50;
  string *local_48;
  long local_40 [2];
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  if (output_directive->generator == (CodeGenerator *)0x0) {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"--","");
    if ((string *)(output_directive->name)._M_string_length < local_e8._M_string_length) {
      bVar5 = false;
    }
    else {
      iVar6 = std::__cxx11::string::compare
                        ((ulong)output_directive,0,(string *)local_e8._M_string_length);
      bVar5 = iVar6 == 0;
    }
    if (bVar5) {
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"_out","");
      psVar2 = (string *)(output_directive->name)._M_string_length;
      if ((psVar2 < local_48) ||
         (iVar6 = std::__cxx11::string::compare
                            ((ulong)output_directive,(long)psVar2 - (long)local_48,local_48),
         iVar6 != 0)) goto LAB_00206717;
      bVar5 = true;
      bVar3 = false;
    }
    else {
LAB_00206717:
      internal::LogMessage::LogMessage
                ((LogMessage *)local_88,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                 ,0x5ff);
      pLVar9 = internal::LogMessage::operator<<
                         ((LogMessage *)local_88,
                          "CHECK failed: HasPrefixString(output_directive.name, \"--\") && HasSuffixString(output_directive.name, \"_out\"): "
                         );
      pLVar9 = internal::LogMessage::operator<<(pLVar9,"Bad name for plugin generator: ");
      pLVar9 = internal::LogMessage::operator<<(pLVar9,&output_directive->name);
      bVar3 = true;
      internal::LogFinisher::operator=((LogFinisher *)&local_c8,pLVar9);
    }
    if (bVar3) {
      internal::LogMessage::~LogMessage((LogMessage *)local_88);
    }
    if ((bVar5) && (local_50 != local_40)) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    anon_unknown_0::PluginName(&local_e8,&this->plugin_prefix_,&output_directive->name);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    pcVar1 = (output_directive->parameter)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar1,pcVar1 + (output_directive->parameter)._M_string_length);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->plugin_parameters_,&local_e8);
    if (pmVar7->_M_string_length != 0) {
      if (local_c8._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_c8);
      }
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->plugin_parameters_,&local_e8);
      std::__cxx11::string::_M_append((char *)&local_c8,(ulong)(pmVar7->_M_dataplus)._M_p);
    }
    bVar5 = GeneratePluginOutput(this,parsed_files,&local_e8,&local_c8,generator_context,&local_a8);
    if (!bVar5) {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(output_directive->name)._M_dataplus._M_p,
                          (output_directive->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_a8._M_dataplus._M_p,local_a8._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      _Var10._M_p = local_e8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) goto LAB_00206933;
      goto LAB_0020693b;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    _Var10._M_p = local_e8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) goto LAB_00206891;
  }
  else {
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_88 + 0x10);
    pcVar1 = (output_directive->parameter)._M_dataplus._M_p;
    local_88._0_8_ = paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar1,pcVar1 + (output_directive->parameter)._M_string_length);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->generator_parameters_,&output_directive->name);
    if (pmVar7->_M_string_length != 0) {
      if ((char *)local_88._8_8_ != (char *)0x0) {
        std::__cxx11::string::append(local_88);
      }
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->generator_parameters_,&output_directive->name);
      std::__cxx11::string::_M_append(local_88,(ulong)(pmVar7->_M_dataplus)._M_p);
    }
    iVar6 = (*output_directive->generator->_vptr_CodeGenerator[3])
                      (output_directive->generator,parsed_files,local_88,generator_context,&local_a8
                      );
    if ((char)iVar6 == '\0') {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(output_directive->name)._M_dataplus._M_p,
                          (output_directive->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_a8._M_dataplus._M_p,local_a8._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      bVar5 = false;
      local_e8.field_2._M_allocated_capacity = local_88._16_8_;
      _Var10._M_p = (pointer)local_88._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._0_8_ != paVar4) {
LAB_00206933:
        operator_delete(_Var10._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
LAB_0020693b:
      if (bVar5 == false) {
        bVar5 = false;
        goto LAB_00206946;
      }
    }
    else {
      local_e8.field_2._M_allocated_capacity = local_88._16_8_;
      _Var10._M_p = (pointer)local_88._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._0_8_ != paVar4) {
LAB_00206891:
        operator_delete(_Var10._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  bVar5 = true;
LAB_00206946:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  return bVar5;
}

Assistant:

bool CommandLineInterface::GenerateOutput(
    const std::vector<const FileDescriptor*>& parsed_files,
    const OutputDirective& output_directive,
    GeneratorContext* generator_context) {
  // Call the generator.
  string error;
  if (output_directive.generator == NULL) {
    // This is a plugin.
    GOOGLE_CHECK(HasPrefixString(output_directive.name, "--") &&
          HasSuffixString(output_directive.name, "_out"))
        << "Bad name for plugin generator: " << output_directive.name;

    string plugin_name = PluginName(plugin_prefix_ , output_directive.name);
    string parameters = output_directive.parameter;
    if (!plugin_parameters_[plugin_name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(plugin_parameters_[plugin_name]);
    }
    if (!GeneratePluginOutput(parsed_files, plugin_name,
                              parameters,
                              generator_context, &error)) {
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  } else {
    // Regular generator.
    string parameters = output_directive.parameter;
    if (!generator_parameters_[output_directive.name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(generator_parameters_[output_directive.name]);
    }
    if (!output_directive.generator->GenerateAll(
        parsed_files, parameters, generator_context, &error)) {
      // Generator returned an error.
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  }

  return true;
}